

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

ssl_verify_result_t CustomVerifyCallback(SSL *ssl,uint8_t *out_alert)

{
  bool bVar1;
  TestConfig *pTVar2;
  TestState *pTVar3;
  TestConfig *config;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  
  pTVar2 = GetTestConfig(ssl);
  bVar1 = CheckVerifyCallback(ssl);
  if (bVar1) {
    if (((pTVar2->async & 1U) != 0) &&
       (pTVar3 = GetTestState(ssl), (pTVar3->custom_verify_ready & 1U) == 0)) {
      return ssl_verify_retry;
    }
    pTVar3 = GetTestState(ssl);
    pTVar3->cert_verified = true;
    if ((pTVar2->verify_fail & 1U) == 0) {
      ssl_local._4_4_ = ssl_verify_ok;
    }
    else {
      ssl_local._4_4_ = ssl_verify_invalid;
    }
  }
  else {
    ssl_local._4_4_ = ssl_verify_invalid;
  }
  return ssl_local._4_4_;
}

Assistant:

static ssl_verify_result_t CustomVerifyCallback(SSL *ssl, uint8_t *out_alert) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return ssl_verify_invalid;
  }

  if (config->async && !GetTestState(ssl)->custom_verify_ready) {
    return ssl_verify_retry;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    return ssl_verify_invalid;
  }

  return ssl_verify_ok;
}